

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

Vec_Ptr_t * Abc_AigDfs(Abc_Ntk_t *pNtk,int fCollectAll,int fCollectCos)

{
  int iVar1;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pAVar2;
  int iVar3;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    Abc_NtkIncrementTravId(pNtk);
    vNodes = Vec_PtrAlloc(100);
    for (iVar3 = 0; iVar3 < pNtk->vCos->nSize; iVar3 = iVar3 + 1) {
      pAVar2 = Abc_NtkCo(pNtk,iVar3);
      Abc_AigDfs_rec((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray],vNodes);
      Abc_NodeSetTravIdCurrent(pAVar2);
      if (fCollectCos != 0) {
        Vec_PtrPush(vNodes,pAVar2);
      }
    }
    if (fCollectAll != 0) {
      for (iVar3 = 0; iVar3 < pNtk->vObjs->nSize; iVar3 = iVar3 + 1) {
        pAVar2 = Abc_NtkObj(pNtk,iVar3);
        if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
          iVar1 = Abc_NodeIsTravIdCurrent(pAVar2);
          if (iVar1 == 0) {
            Abc_AigDfs_rec(pAVar2,vNodes);
          }
        }
      }
    }
    return vNodes;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                ,0x4b3,"Vec_Ptr_t *Abc_AigDfs(Abc_Ntk_t *, int, int)");
}

Assistant:

Vec_Ptr_t * Abc_AigDfs( Abc_Ntk_t * pNtk, int fCollectAll, int fCollectCos )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // go through the PO nodes and call for each of them
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        Abc_AigDfs_rec( Abc_ObjFanin0(pNode), vNodes );
        Abc_NodeSetTravIdCurrent( pNode );
        if ( fCollectCos )
            Vec_PtrPush( vNodes, pNode );
    }
    // collect dangling nodes if asked to
    if ( fCollectAll )
    {
        Abc_NtkForEachNode( pNtk, pNode, i )
            if ( !Abc_NodeIsTravIdCurrent(pNode) )
                Abc_AigDfs_rec( pNode, vNodes );
    }
    return vNodes;
}